

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O3

int __thiscall
jwt::verifier<jwt::default_clock>::verify(verifier<jwt::default_clock> *this,decoded_jwt *jwt)

{
  pointer pcVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  string *psVar6;
  const_iterator cVar7;
  long lVar8;
  const_iterator cVar9;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>_>_>_>
  *this_00;
  date dVar10;
  size_t sVar11;
  const_iterator cVar12;
  _Rb_tree_node_base *p_Var13;
  long *extraout_RAX;
  token_verification_exception *ptVar14;
  undefined8 uVar15;
  long *plVar16;
  payload *ppVar17;
  _Hash_node_base *p_Var18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  anon_class_1_0_00000001 assert_claim_eq;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected;
  string data;
  string sig;
  undefined1 local_108 [55];
  anon_class_1_0_00000001 local_d1;
  payload *local_d0;
  undefined1 local_c8 [48];
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78 [2];
  long local_68 [2];
  decoded_jwt *local_58;
  string local_50;
  
  pcVar1 = local_108 + 0x10;
  pcVar2 = (jwt->header_base64)._M_dataplus._M_p;
  local_108._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_108,pcVar2,pcVar2 + (jwt->header_base64)._M_string_length);
  std::__cxx11::string::append(local_108);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             (local_108,(ulong)(jwt->payload_base64)._M_dataplus._M_p);
  local_98 = &local_88;
  plVar16 = plVar5 + 2;
  if ((long *)*plVar5 == plVar16) {
    local_88 = *plVar16;
    lStack_80 = plVar5[3];
  }
  else {
    local_88 = *plVar16;
    local_98 = (long *)*plVar5;
  }
  local_90 = plVar5[1];
  *plVar5 = (long)plVar16;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((pointer)local_108._0_8_ != pcVar1) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
  }
  local_78[0] = local_68;
  pcVar2 = (jwt->signature)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,pcVar2,pcVar2 + (jwt->signature)._M_string_length);
  psVar6 = header::get_algorithm_abi_cxx11_(&jwt->super_header);
  this_00 = &this->algs;
  cVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,psVar6);
  if (cVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    ptVar14 = (token_verification_exception *)__cxa_allocate_exception(0x10);
    local_108._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"wrong algorithm","");
    token_verification_exception::token_verification_exception(ptVar14,(string *)local_108);
    __cxa_throw(ptVar14,&token_verification_exception::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,psVar6);
  if (cVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
    goto LAB_00105dee;
  }
  (**(code **)(**(long **)((long)cVar7.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>_>,_true>
                                 ._M_cur + 0x28) + 0x10))
            (*(long **)((long)cVar7.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>_>,_true>
                              ._M_cur + 0x28),&local_98,local_78);
  lVar8 = std::chrono::_V2::system_clock::now();
  ppVar17 = &jwt->super_payload;
  bVar3 = payload::has_expires_at(ppVar17);
  local_d0 = ppVar17;
  if (bVar3) {
    local_108._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"exp","");
    cVar9 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)this,(key_type *)local_108);
    if (cVar9.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_true>
        ._M_cur == (__node_type *)0x0) {
      this_00 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>_>_>_>
                 *)this->default_leeway;
LAB_00105982:
      if ((pointer)local_108._0_8_ != pcVar1) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
      }
      dVar10 = payload::get_expires_at(ppVar17);
      if ((long)dVar10.__d.__r + (long)this_00 * 1000000000 < lVar8) {
LAB_00105dee:
        ptVar14 = (token_verification_exception *)__cxa_allocate_exception(0x10);
        local_108._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"token expired","");
        token_verification_exception::token_verification_exception(ptVar14,(string *)local_108);
        __cxa_throw(ptVar14,&token_verification_exception::typeinfo,
                    std::runtime_error::~runtime_error);
      }
      goto LAB_001059b3;
    }
    local_c8._0_8_ = local_c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"exp","");
    cVar9 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)this,(key_type *)local_c8);
    if (cVar9.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_true>
        ._M_cur != (__node_type *)0x0) {
      this_00 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>_>_>_>
                 *)claim::as_int((claim *)((long)cVar9.
                                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_true>
                                                 ._M_cur + 0x28));
      ppVar17 = local_d0;
      if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
        ppVar17 = local_d0;
      }
      goto LAB_00105982;
    }
    std::__throw_out_of_range("_Map_base::at");
LAB_00105eee:
    std::__throw_out_of_range("_Map_base::at");
LAB_00105efa:
    uVar15 = std::__throw_out_of_range("_Map_base::at");
    if ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>_>_>_>
         *)local_108._0_8_ != this_00) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    if ((char)pcVar1 != '\0') {
      __cxa_free_exception(this);
    }
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    _Unwind_Resume(uVar15);
  }
LAB_001059b3:
  bVar3 = payload::has_issued_at(ppVar17);
  if (bVar3) {
    local_108._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"iat","");
    cVar9 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)this,(key_type *)local_108);
    if (cVar9.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_true>
        ._M_cur == (__node_type *)0x0) {
      this_00 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>_>_>_>
                 *)this->default_leeway;
    }
    else {
      local_c8._0_8_ = local_c8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"iat","");
      cVar9 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)this,(key_type *)local_c8);
      if (cVar9.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_true>
          ._M_cur == (__node_type *)0x0) goto LAB_00105eee;
      this_00 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>_>_>_>
                 *)claim::as_int((claim *)((long)cVar9.
                                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_true>
                                                 ._M_cur + 0x28));
      ppVar17 = local_d0;
      if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
        ppVar17 = local_d0;
      }
    }
    if ((pointer)local_108._0_8_ != pcVar1) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    dVar10 = payload::get_issued_at(ppVar17);
    if (lVar8 < (long)dVar10.__d.__r + (long)this_00 * -1000000000) {
      ptVar14 = (token_verification_exception *)__cxa_allocate_exception(0x10);
      local_108._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"token expired","");
      token_verification_exception::token_verification_exception(ptVar14,(string *)local_108);
      __cxa_throw(ptVar14,&token_verification_exception::typeinfo,std::runtime_error::~runtime_error
                 );
    }
  }
  bVar3 = payload::has_not_before(ppVar17);
  if (bVar3) {
    local_108._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"nbf","");
    cVar9 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)this,(key_type *)local_108);
    if (cVar9.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_true>
        ._M_cur == (__node_type *)0x0) {
      sVar11 = this->default_leeway;
    }
    else {
      local_c8._0_8_ = local_c8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"nbf","");
      cVar9 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)this,(key_type *)local_c8);
      if (cVar9.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_true>
          ._M_cur == (__node_type *)0x0) goto LAB_00105efa;
      sVar11 = claim::as_int((claim *)((long)cVar9.
                                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_true>
                                             ._M_cur + 0x28));
      ppVar17 = local_d0;
      if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
        ppVar17 = local_d0;
      }
    }
    if ((pointer)local_108._0_8_ != pcVar1) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    dVar10 = payload::get_not_before(ppVar17);
    if (lVar8 < (long)((long)dVar10.__d.__r + sVar11 * -1000000000)) {
      ptVar14 = (token_verification_exception *)__cxa_allocate_exception(0x10);
      local_108._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"token expired","");
      token_verification_exception::token_verification_exception(ptVar14,(string *)local_108);
      __cxa_throw(ptVar14,&token_verification_exception::typeinfo,std::runtime_error::~runtime_error
                 );
    }
  }
  p_Var18 = (this->claims)._M_h._M_before_begin._M_nxt;
  local_58 = jwt;
  if (p_Var18 != (_Hash_node_base *)0x0) {
    do {
      psVar6 = (string *)(p_Var18 + 1);
      iVar4 = std::__cxx11::string::compare((char *)psVar6);
      if (((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)psVar6), iVar4 != 0)) &&
         (iVar4 = std::__cxx11::string::compare((char *)psVar6), iVar4 != 0)) {
        iVar4 = std::__cxx11::string::compare((char *)psVar6);
        ppVar17 = local_d0;
        if (iVar4 == 0) {
          bVar3 = payload::has_audience(local_d0);
          if (!bVar3) {
            ptVar14 = (token_verification_exception *)__cxa_allocate_exception(0x10);
            local_108._0_8_ = local_108 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_108,"token doesn\'t contain the required audience","");
            token_verification_exception::token_verification_exception(ptVar14,(string *)local_108);
            __cxa_throw(ptVar14,&token_verification_exception::typeinfo,
                        std::runtime_error::~runtime_error);
          }
          payload::get_audience_abi_cxx11_
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_108,ppVar17);
          claim::as_set_abi_cxx11_
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_c8,(claim *)(p_Var18 + 5));
          for (p_Var13 = (_Rb_tree_node_base *)local_c8._24_8_;
              p_Var13 != (_Rb_tree_node_base *)(local_c8 + 8);
              p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
            cVar12 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_108,(key_type *)(p_Var13 + 1));
            if (cVar12._M_node == (_Base_ptr)(local_108 + 8)) {
              ptVar14 = (token_verification_exception *)__cxa_allocate_exception(0x10);
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,"token doesn\'t contain the required audience","");
              token_verification_exception::token_verification_exception(ptVar14,&local_50);
              __cxa_throw(ptVar14,&token_verification_exception::typeinfo,
                          std::runtime_error::~runtime_error);
            }
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_c8);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_108);
        }
        else {
          verify::anon_class_1_0_00000001::operator()
                    (&local_d1,local_58,psVar6,(claim *)(p_Var18 + 5));
        }
      }
      p_Var18 = p_Var18->_M_nxt;
    } while (p_Var18 != (_Hash_node_base *)0x0);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  plVar5 = &local_88;
  if (local_98 != plVar5) {
    operator_delete(local_98,local_88 + 1);
    plVar5 = extraout_RAX;
  }
  return (int)plVar5;
}

Assistant:

void verify(const decoded_jwt& jwt) const {
			const std::string data = jwt.get_header_base64() + "." + jwt.get_payload_base64();
			const std::string sig = jwt.get_signature();
			const std::string& algo = jwt.get_algorithm();
			if (algs.count(algo) == 0)
				throw token_verification_exception("wrong algorithm");
			algs.at(algo)->verify(data, sig);

			auto assert_claim_eq = [](const decoded_jwt& jwt, const std::string& key, const claim& c) {
				if (!jwt.has_payload_claim(key))
					throw token_verification_exception("decoded_jwt is missing " + key + " claim");
				auto& jc = jwt.get_payload_claim(key);
				if (jc.get_type() != c.get_type())
					throw token_verification_exception("claim " + key + " type mismatch");
				if (c.get_type() == claim::type::int64) {
					if (c.as_date() != jc.as_date())
						throw token_verification_exception("claim " + key + " does not match expected");
				}
				else if (c.get_type() == claim::type::array) {
					auto s1 = c.as_set();
					auto s2 = jc.as_set();
					if (s1.size() != s2.size())
						throw token_verification_exception("claim " + key + " does not match expected");
					auto it1 = s1.cbegin();
					auto it2 = s2.cbegin();
					while (it1 != s1.cend() && it2 != s2.cend()) {
						if (*it1++ != *it2++)
							throw token_verification_exception("claim " + key + " does not match expected");
					}
				}
				else if (c.get_type() == claim::type::object) {
					if( c.to_json().serialize() != jc.to_json().serialize())
						throw token_verification_exception("claim " + key + " does not match expected");
				}
				else if (c.get_type() == claim::type::string) {
					if (c.as_string() != jc.as_string())
						throw token_verification_exception("claim " + key + " does not match expected");
				}
				else throw token_verification_exception("internal error");
			};

			auto time = clock.now();

			if (jwt.has_expires_at()) {
				auto leeway = claims.count("exp") == 1 ? std::chrono::system_clock::to_time_t(claims.at("exp").as_date()) : default_leeway;
				auto exp = jwt.get_expires_at();
				if (time > exp + std::chrono::seconds(leeway))
					throw token_verification_exception("token expired");
			}
			if (jwt.has_issued_at()) {
				auto leeway = claims.count("iat") == 1 ? std::chrono::system_clock::to_time_t(claims.at("iat").as_date()) : default_leeway;
				auto iat = jwt.get_issued_at();
				if (time < iat - std::chrono::seconds(leeway))
					throw token_verification_exception("token expired");
			}
			if (jwt.has_not_before()) {
				auto leeway = claims.count("nbf") == 1 ? std::chrono::system_clock::to_time_t(claims.at("nbf").as_date()) : default_leeway;
				auto nbf = jwt.get_not_before();
				if (time < nbf - std::chrono::seconds(leeway))
					throw token_verification_exception("token expired");
			}
			for (auto& c : claims)
			{
				if (c.first == "exp" || c.first == "iat" || c.first == "nbf") {
					// Nothing to do here, already checked
				}
				else if (c.first == "aud") {
					if (!jwt.has_audience())
						throw token_verification_exception("token doesn't contain the required audience");
					auto aud = jwt.get_audience();
					auto expected = c.second.as_set();
					for (auto& e : expected)
						if (aud.count(e) == 0)
							throw token_verification_exception("token doesn't contain the required audience");
				}
				else {
					assert_claim_eq(jwt, c.first, c.second);
				}
			}
		}